

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_movem_16_re_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar2 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar3 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  uVar5 = (uint)(short)uVar3;
  lVar7 = 0;
  iVar6 = 0;
  do {
    if ((uVar2 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
      uVar1 = m68ki_cpu.dar[lVar7];
      my_fc_handler(m68ki_cpu.s_flag | 1);
      uVar4 = uVar5;
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar4 = pmmu_translate_addr(uVar5);
      }
      m68k_write_memory_16(uVar4 & m68ki_cpu.address_mask,(uint)(ushort)uVar1);
      uVar5 = uVar5 + 2;
      iVar6 = iVar6 + 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  m68ki_remaining_cycles = m68ki_remaining_cycles - (iVar6 << ((byte)m68ki_cpu.cyc_movem_w & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_16_re_aw(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_AW_16();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			m68ki_write_16(ea, MASK_OUT_ABOVE_16(REG_DA[i]));
			ea += 2;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_W);
}